

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O3

LArYieldResult * __thiscall
NEST::LArNEST::GetRecombinationYields
          (LArYieldResult *__return_storage_ptr__,LArNEST *this,double TotalYields,
          double ElectronYields,double PhotonYields,double energy,double efield)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = this->fWorkQuantaFunction;
  dVar2 = this->fNexOverNion;
  __return_storage_ptr__->TotalYield = TotalYields;
  __return_storage_ptr__->QuantaYield = ElectronYields;
  __return_storage_ptr__->LightYield = PhotonYields;
  __return_storage_ptr__->Nph = PhotonYields * energy;
  __return_storage_ptr__->Ne = ElectronYields * energy;
  dVar3 = ElectronYields * energy + PhotonYields * energy;
  dVar2 = dVar3 / (dVar2 + 1.0);
  __return_storage_ptr__->Nex = dVar3 - dVar2;
  __return_storage_ptr__->Nion = dVar2;
  __return_storage_ptr__->Lindhard = (TotalYields / energy) * dVar1 * 0.001;
  __return_storage_ptr__->ElectricField = efield;
  return __return_storage_ptr__;
}

Assistant:

LArYieldResult LArNEST::GetRecombinationYields(double TotalYields,
                                               double ElectronYields,
                                               double PhotonYields,
                                               double energy, double efield) {
  double Ne = ElectronYields * energy;
  double Nph = PhotonYields * energy;
  double Nq = Ne + Nph;

  /// recombination
  // Thomas-Imel is not used here, since alpha = Nex/Nion
  // is assumed to be a fixed quantity, and so the
  // recombination probability is constrained through
  // the yields functions:
  //      Nion = Nq/(1 + alpha) = (Ye + Yph)E/(1 + alpha)
  double Nion = Nq / (1 + fNexOverNion);
  double Nex = Nq - Nion;

  double WQ_eV = fWorkQuantaFunction;
  double Lindhard = (TotalYields / energy) * WQ_eV * 1e-3;
  LArYieldResult result{TotalYields, ElectronYields, PhotonYields, Nph,   Ne,
                        Nex,         Nion,           Lindhard,     efield};
  return result;
}